

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

size_t sentencepiece::string_util::EncodeUTF8(char32 c,char *output)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  byte bVar4;
  size_t sStack_8;
  
  if (c < 0x80) {
    sStack_8 = 1;
  }
  else if (c < 0x800) {
    output[1] = (byte)c & 0x3f | 0x80;
    c = (char32)(byte)((byte)(c >> 6) | 0xc0);
    sStack_8 = 2;
  }
  else {
    uVar3 = 0xfffd;
    if (c < 0x110000) {
      uVar3 = (ulong)c;
    }
    bVar1 = (byte)uVar3 & 0x3f | 0x80;
    bVar4 = (byte)(uVar3 >> 6) & 0x3f | 0x80;
    bVar2 = (byte)(uVar3 >> 0xc);
    if (0xffff < (uint)uVar3) {
      output[3] = bVar1;
      output[2] = bVar4;
      output[1] = bVar2 & 0x3f | 0x80;
      bVar2 = (byte)((uint)uVar3 >> 0x12) | 0xf0;
      sStack_8 = 4;
      goto LAB_00207542;
    }
    output[2] = bVar1;
    output[1] = bVar4;
    c = (char32)(bVar2 | 0xe0);
    sStack_8 = 3;
  }
  bVar2 = (byte)c;
LAB_00207542:
  *output = bVar2;
  return sStack_8;
}

Assistant:

size_t EncodeUTF8(char32 c, char *output) {
  if (c <= 0x7F) {
    *output = static_cast<char>(c);
    return 1;
  }

  if (c <= 0x7FF) {
    output[1] = 0x80 | (c & 0x3F);
    c >>= 6;
    output[0] = 0xC0 | c;
    return 2;
  }

  // if `c` is out-of-range, convert it to REPLACEMENT CHARACTER (U+FFFD).
  // This treatment is the same as the original runetochar.
  if (c > 0x10FFFF) c = kUnicodeError;

  if (c <= 0xFFFF) {
    output[2] = 0x80 | (c & 0x3F);
    c >>= 6;
    output[1] = 0x80 | (c & 0x3F);
    c >>= 6;
    output[0] = 0xE0 | c;
    return 3;
  }

  output[3] = 0x80 | (c & 0x3F);
  c >>= 6;
  output[2] = 0x80 | (c & 0x3F);
  c >>= 6;
  output[1] = 0x80 | (c & 0x3F);
  c >>= 6;
  output[0] = 0xF0 | c;

  return 4;
}